

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O0

shared_ptr<ONX_Model> __thiscall ONX_ModelTest::ReadWriteReadModel(ONX_ModelTest *this)

{
  int iVar1;
  bool bVar2;
  element_type *peVar3;
  element_type *peVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<ONX_Model> sVar5;
  ONX_Model *copy_model;
  undefined1 local_28 [4];
  int i;
  shared_ptr<ONX_Model> source_model;
  ONX_ModelTest *this_local;
  shared_ptr<ONX_Model> *nullsp;
  
  SourceModel((ONX_ModelTest *)local_28);
  bVar2 = std::operator!=((nullptr_t)0x0,(shared_ptr<ONX_Model> *)local_28);
  if (bVar2) {
    for (copy_model._4_4_ = 1; copy_model._4_4_ < 3; copy_model._4_4_ = copy_model._4_4_ + 1) {
      peVar3 = std::__shared_ptr<ONX_Model,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<ONX_Model,_(__gnu_cxx::_Lock_policy)2> *)
                          (in_RSI + 0xf0 + (long)copy_model._4_4_ * 0x10));
      if ((peVar3 != (element_type *)0x0) &&
         (iVar1 = peVar3->m_3dm_file_version,
         peVar4 = std::__shared_ptr_access<ONX_Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<ONX_Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_28), iVar1 == peVar4->m_3dm_file_version)) {
        std::shared_ptr<ONX_Model>::shared_ptr
                  ((shared_ptr<ONX_Model> *)this,
                   (shared_ptr<ONX_Model> *)(in_RSI + 0xf0 + (long)copy_model._4_4_ * 0x10));
        goto LAB_00601689;
      }
    }
  }
  std::shared_ptr<ONX_Model>::shared_ptr((shared_ptr<ONX_Model> *)this);
LAB_00601689:
  std::shared_ptr<ONX_Model>::~shared_ptr((shared_ptr<ONX_Model> *)local_28);
  sVar5.super___shared_ptr<ONX_Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar5.super___shared_ptr<ONX_Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<ONX_Model>)sVar5.super___shared_ptr<ONX_Model,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ONX_Model> ONX_ModelTest::ReadWriteReadModel() const
{
  const auto source_model = SourceModel();
  if (nullptr != source_model)
  {
    for (int i = 1; i < 3; i++)
    {
      const ONX_Model* copy_model = m_model[i].get();
      if (nullptr == copy_model)
        continue;
      if (copy_model->m_3dm_file_version != source_model->m_3dm_file_version)
        continue;
      return m_model[i];
    }
  }
  std::shared_ptr<ONX_Model> nullsp;
  return nullsp;
}